

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type.cc
# Opt level: O0

void __thiscall iqxmlrpc::Date_time::Date_time(Date_time *this,bool use_lt)

{
  tm local_68;
  ptime local_20;
  ptime p;
  bool use_lt_local;
  Date_time *this_local;
  
  p.
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  .time_.time_count_.value_._7_1_ = use_lt;
  Value_type::Value_type(&this->super_Value_type);
  (this->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Date_time_00254e30;
  std::__cxx11::string::string((string *)&this->cache);
  if ((p.
       super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
       .time_.time_count_.value_._7_1_ & 1) == 0) {
    local_20 = boost::date_time::second_clock<boost::posix_time::ptime>::universal_time();
  }
  else {
    local_20 = boost::date_time::second_clock<boost::posix_time::ptime>::local_time();
  }
  boost::posix_time::to_tm(&local_68,&local_20);
  memcpy(&this->tm_,&local_68,0x38);
  return;
}

Assistant:

Date_time::Date_time( bool use_lt )
{
  using namespace boost::posix_time;
  ptime p = use_lt ? second_clock::local_time() : second_clock::universal_time();
  tm_ = to_tm(p);
}